

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O1

wchar_t rd_monsters_aux(chunk *c)

{
  loc grid;
  loc_conflict grid_00;
  loc_conflict grid_01;
  bool bVar1;
  int16_t iVar2;
  object *poVar3;
  uint uVar4;
  wchar_t wVar5;
  char *pcVar6;
  ulong uVar7;
  int16_t *ip;
  element_info *ip_00;
  uint8_t tmp8u;
  uint16_t tmp16u;
  uint16_t limit;
  monster_conflict monster_body;
  byte local_235;
  ushort local_234;
  ushort local_232;
  monster_race *local_230;
  monster local_228;
  int local_88;
  char local_84;
  
  wVar5 = L'\0';
  if (player->is_dead == false) {
    rd_u16b(&local_232);
    uVar7 = (ulong)local_232;
    if (z_info->level_monster_max < local_232) {
      pcVar6 = "Too many (%d) monster entries!";
LAB_00163fb3:
      pcVar6 = format(pcVar6,uVar7);
      note(pcVar6);
      wVar5 = L'\xffffffff';
    }
    else {
      wVar5 = L'\0';
      if (1 < local_232) {
        uVar4 = 1;
        do {
          memset(&local_228,0,0x1a0);
          rd_u16b(&local_234);
          local_228.midx = (wchar_t)local_234;
          rd_string((char *)&local_88,0x50);
          local_230 = lookup_monster((char *)&local_88);
          local_228.race = local_230;
          if (local_230 == (monster_race *)0x0) {
            pcVar6 = format("Monster race %s no longer exists!",&local_88);
            note(pcVar6);
          }
          else {
            rd_string((char *)&local_88,0x50);
            if (local_84 == '\0' && local_88 == 0x656e6f6e) {
              local_228.original_race = (monster_race *)0x0;
            }
            else {
              local_228.original_race = lookup_monster((char *)&local_88);
            }
            rd_byte(&local_235);
            local_228.grid.y = (int)local_235;
            rd_byte(&local_235);
            local_228.grid.x = (int)local_235;
            rd_s16b(&local_228.hp);
            rd_s16b(&local_228.maxhp);
            rd_byte(&local_228.mspeed);
            rd_byte(&local_228.energy);
            rd_byte(&local_235);
            if (local_235 != 0) {
              ip = local_228.m_timed;
              uVar7 = 0;
              do {
                rd_s16b(ip);
                uVar7 = uVar7 + 1;
                ip = ip + 1;
              } while (uVar7 < local_235);
            }
            if (mflag_size != '\0') {
              uVar7 = 0;
              do {
                rd_byte(local_228.mflag + uVar7);
                uVar7 = uVar7 + 1;
              } while (uVar7 < mflag_size);
            }
            if (of_size != '\0') {
              uVar7 = 0;
              do {
                rd_byte(local_228.known_pstate.flags + uVar7);
                uVar7 = uVar7 + 1;
              } while (uVar7 < of_size);
            }
            if (elem_max != '\0') {
              ip_00 = local_228.known_pstate.el_info;
              uVar7 = 0;
              do {
                rd_s16b(&ip_00->res_level);
                uVar7 = uVar7 + 1;
                ip_00 = ip_00 + 1;
              } while (uVar7 < elem_max);
            }
            rd_u16b(&local_234);
            poVar3 = local_228.mimicked_obj;
            if (local_234 == 0) {
LAB_00163ea5:
              local_228.mimicked_obj = poVar3;
              bVar1 = false;
            }
            else {
              grid.y = local_228.grid.y;
              grid.x = local_228.grid.x;
              for (poVar3 = square_object((chunk_conflict *)c,grid); bVar1 = poVar3 == (object *)0x0
                  , !bVar1; poVar3 = poVar3->next) {
                if ((int)poVar3->mimicking_m_idx == (uint)local_234) goto LAB_00163ea5;
              }
            }
            poVar3 = rd_item();
            while (poVar3 != (object *)0x0) {
              pile_insert(&local_228.held_obj,poVar3);
              uVar7 = (ulong)poVar3->oidx;
              if (uVar7 == 0) {
                __assert_fail("obj->oidx",
                              "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/load.c"
                              ,0x14c,"_Bool rd_monster(struct chunk *, struct monster *)");
              }
              if (c->objects[uVar7] != (object *)0x0) {
                __assert_fail("c->objects[obj->oidx] == NULL",
                              "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/load.c"
                              ,0x14d,"_Bool rd_monster(struct chunk *, struct monster *)");
              }
              c->objects[uVar7] = poVar3;
              poVar3 = rd_item();
            }
            rd_u16b(&local_234);
            local_228.group_info[0].index = (wchar_t)local_234;
            rd_byte(&local_235);
            local_228.group_info[0].role = (monster_group_role)local_235;
            rd_u16b(&local_234);
            local_228.group_info[1].index = (wchar_t)local_234;
            rd_byte(&local_235);
            local_228.group_info[1].role = (monster_group_role)local_235;
            if (bVar1) {
              grid_00.y = local_228.grid.y;
              grid_00.x = local_228.grid.x;
              delete_monster(c,grid_00);
            }
          }
          if (local_230 == (monster_race *)0x0) {
            pcVar6 = "Cannot read monster %d";
LAB_00163fb1:
            uVar7 = (ulong)uVar4;
            goto LAB_00163fb3;
          }
          grid_01.y = local_228.grid.y;
          grid_01.x = local_228.grid.x;
          iVar2 = place_monster(c,grid_01,&local_228,'\0');
          if (uVar4 != (int)iVar2) {
            pcVar6 = "Cannot place monster %d";
            goto LAB_00163fb1;
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 < local_232);
        wVar5 = L'\0';
      }
    }
  }
  return wVar5;
}

Assistant:

static int rd_monsters_aux(struct chunk *c)
{
	int i;
	uint16_t limit;

	/* Only if the player's alive */
	if (player->is_dead)
		return 0;

	/* Read the monster count */
	rd_u16b(&limit);
	if (limit > z_info->level_monster_max) {
		note(format("Too many (%d) monster entries!", limit));
		return (-1);
	}

	/* Read the monsters */
	for (i = 1; i < limit; i++) {
		struct monster *mon;
		struct monster monster_body;

		/* Get local monster */
		mon = &monster_body;
		memset(mon, 0, sizeof(*mon));

		/* Read the monster */
		if (!rd_monster(c, mon)) {
			note(format("Cannot read monster %d", i));
			return (-1);
		}

		/* Place monster in dungeon */
		if (place_monster(c, mon->grid, mon, 0) != i) {
			note(format("Cannot place monster %d", i));
			return (-1);
		}
	}

	return 0;
}